

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractWrittenFont.cpp
# Opt level: O2

void __thiscall AbstractWrittenFont::~AbstractWrittenFont(AbstractWrittenFont *this)

{
  WrittenFontRepresentation *pWVar1;
  
  (this->super_IWrittenFont)._vptr_IWrittenFont = (_func_int **)&PTR__AbstractWrittenFont_00370d38;
  pWVar1 = this->mCIDRepresentation;
  if (pWVar1 != (WrittenFontRepresentation *)0x0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
                 *)pWVar1);
  }
  operator_delete(pWVar1,0x38);
  pWVar1 = this->mANSIRepresentation;
  if (pWVar1 != (WrittenFontRepresentation *)0x0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
                 *)pWVar1);
  }
  operator_delete(pWVar1,0x38);
  return;
}

Assistant:

AbstractWrittenFont::~AbstractWrittenFont(void)
{
	delete mCIDRepresentation;
	delete mANSIRepresentation;
}